

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourceCode.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_sourceCode_create
          (sysbvm_context_t *context,sysbvm_tuple_t text,sysbvm_tuple_t directory,
          sysbvm_tuple_t name,sysbvm_tuple_t language)

{
  sysbvm_object_tuple_t *psVar1;
  ulong uVar2;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).sourceCodeType,7);
  (psVar1->field_1).pointers[0] = text;
  psVar1[1].header.field_0.typePointer = directory;
  psVar1[1].header.identityHashAndFlags = (int)name;
  psVar1[1].header.objectSize = (int)(name >> 0x20);
  psVar1[1].field_1.pointers[0] = language;
  psVar1[2].header.field_0.typePointer = (ulong)(directory != 0) << 4 | 0xf;
  if ((text & 0xf) == 0 && text != 0) {
    uVar2 = (ulong)*(uint *)(text + 0xc) << 4 | 0xb;
  }
  else {
    uVar2 = 0xb;
  }
  psVar1[2].header.identityHashAndFlags = (int)uVar2;
  psVar1[2].header.objectSize = (int)(uVar2 >> 0x20);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_sourceCode_create(sysbvm_context_t *context, sysbvm_tuple_t text, sysbvm_tuple_t directory, sysbvm_tuple_t name, sysbvm_tuple_t language)
{
    sysbvm_sourceCode_t *result = (sysbvm_sourceCode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.sourceCodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_sourceCode_t));
    result->text = text;
    result->directory = directory;
    result->name = name;
    result->language = language;
    result->isInFile = directory ? SYSBVM_TRUE_TUPLE : SYSBVM_FALSE_TUPLE;
    result->textSize = sysbvm_tuple_size_encode(context, sysbvm_tuple_getSizeInBytes(result->text));
    return (sysbvm_tuple_t)result;
}